

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_SoundAlert
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  TArray<VMValue,_VMValue> *pTVar5;
  char *pcVar6;
  AActor *target;
  AActor *emitter;
  bool bVar7;
  bool bVar8;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003f30bb;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f30a2:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f30bb:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10b,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  emitter = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (emitter == (AActor *)0x0) goto LAB_003f2fa7;
    pPVar3 = (emitter->super_DThinker).super_DObject.Class;
    pTVar5 = defaultparam;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(emitter->super_DThinker).super_DObject._vptr_DObject)(emitter);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (emitter->super_DThinker).super_DObject.Class = pPVar3;
      uVar4 = extraout_RDX;
    }
    bVar7 = pPVar3 == (PClass *)0x0;
    ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar7);
    uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar7);
    bVar8 = pPVar3 == pPVar1;
    if (!bVar8 && !bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar3 != (PClass *)0x0);
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    pTVar5 = (TArray<VMValue,_VMValue> *)CONCAT71((int7)((ulong)pTVar5 >> 8),bVar8 || bVar7);
    if ((char)ret == '\0') {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f30bb;
    }
  }
  else {
    if (emitter != (AActor *)0x0) goto LAB_003f30a2;
LAB_003f2fa7:
    emitter = (AActor *)0x0;
    pTVar5 = defaultparam;
  }
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003f30da;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003f30ab:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f30da:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10c,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_003f302f;
    pPVar3 = (target->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target,pTVar5,uVar4,ret);
      pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar2);
      (target->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f30da;
    }
  }
  else {
    if (target != (AActor *)0x0) goto LAB_003f30ab;
LAB_003f302f:
    target = (AActor *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003f3102;
    }
    iVar2 = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003f3102:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x10d,
                    "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\x01') goto LAB_003f307a;
      pcVar6 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003f3121;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\x01') {
LAB_003f307a:
    P_NoiseAlert(target,emitter,iVar2 != 0,param[3].field_0.f);
    return 0;
  }
  pcVar6 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003f3121:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x10e,
                "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SoundAlert)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(target, AActor);
	PARAM_BOOL_DEF(splash);
	PARAM_FLOAT_DEF(maxdist);
	// Note that the emitter is self, not the target of the alert! Target can be NULL.
	P_NoiseAlert(target, self, splash, maxdist);
	return 0;
}